

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sim.cc
# Opt level: O0

void __thiscall kratos::Simulator::process_stmt(Simulator *this,AssignStmt *stmt,Var *param_2)

{
  bool bVar1;
  AssignmentType AVar2;
  Var **ppVVar3;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__args_1;
  undefined1 local_48 [8];
  optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> val;
  Var *right;
  Var *param_2_local;
  AssignStmt *stmt_local;
  Simulator *this_local;
  
  ppVVar3 = AssignStmt::right(stmt);
  val.super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
  .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>._24_8_
       = *ppVVar3;
  eval_expr((optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)local_48,this,
            (Var *)val.
                   super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
                   ._M_payload.
                   super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
                   .
                   super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                   ._24_8_);
  bVar1 = std::optional::operator_cast_to_bool((optional *)local_48);
  if (bVar1) {
    AVar2 = AssignStmt::assign_type(stmt);
    if (AVar2 == NonBlocking) {
      ppVVar3 = AssignStmt::left(stmt);
      __args_1 = std::optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::
                 operator*((optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)
                           local_48);
      std::
      unordered_map<kratos::Var*,std::vector<unsigned_long,std::allocator<unsigned_long>>,std::hash<kratos::Var*>,std::equal_to<kratos::Var*>,std::allocator<std::pair<kratos::Var*const,std::vector<unsigned_long,std::allocator<unsigned_long>>>>>
      ::emplace<kratos::Var*&,std::vector<unsigned_long,std::allocator<unsigned_long>>&>
                ((unordered_map<kratos::Var*,std::vector<unsigned_long,std::allocator<unsigned_long>>,std::hash<kratos::Var*>,std::equal_to<kratos::Var*>,std::allocator<std::pair<kratos::Var*const,std::vector<unsigned_long,std::allocator<unsigned_long>>>>>
                  *)&this->nba_values_,ppVVar3,__args_1);
    }
    else {
      ppVVar3 = AssignStmt::left(stmt);
      set_complex_value_(this,*ppVVar3,
                         (optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)
                         local_48);
    }
  }
  std::optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::~optional
            ((optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)local_48);
  return;
}

Assistant:

void Simulator::process_stmt(kratos::AssignStmt *stmt, const Var *) {
    auto *right = stmt->right();
    auto val = eval_expr(right);
    if (val) {
        if (stmt->assign_type() != AssignmentType::NonBlocking)
            set_complex_value_(stmt->left(), val);
        else
            nba_values_.emplace(stmt->left(), *val);
    }
}